

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

file_conflict * file_create_virtual_dir(archive_write *a,xar_conflict *xar,char *pathname)

{
  file_conflict *pfVar1;
  file_conflict *pfVar2;
  
  pfVar1 = file_new(a,(archive_entry *)0x0);
  pfVar2 = (file_conflict *)0x0;
  if (pfVar1 != (file_conflict *)0x0) {
    archive_entry_set_pathname(pfVar1->entry,(char *)xar);
    archive_entry_set_mode(pfVar1->entry,0x416d);
    pfVar1->field_0x168 = pfVar1->field_0x168 | 3;
    pfVar2 = pfVar1;
  }
  return pfVar2;
}

Assistant:

static struct file *
file_create_virtual_dir(struct archive_write *a, struct xar *xar,
    const char *pathname)
{
	struct file *file;

	(void)xar; /* UNUSED */

	file = file_new(a, NULL);
	if (file == NULL)
		return (NULL);
	archive_entry_set_pathname(file->entry, pathname);
	archive_entry_set_mode(file->entry, 0555 | AE_IFDIR);

	file->dir = 1;
	file->virtual = 1;

	return (file);
}